

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QLatin1String *pQVar1;
  byte bVar2;
  long lVar3;
  QChar *pQVar4;
  QString *pQVar5;
  long lVar6;
  char16_t *pcVar7;
  
  lVar3 = (p->a).a.a.a.a.a.m_size;
  QAbstractConcatenable::appendLatin1To((p->a).a.a.a.a.a,*out);
  pQVar4 = *out;
  *out = pQVar4 + lVar3;
  pQVar5 = (p->a).a.a.a.a.b;
  lVar6 = (pQVar5->d).size;
  if (lVar6 != 0) {
    pcVar7 = (pQVar5->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar4 + lVar3,pcVar7,lVar6 * 2);
  }
  pQVar4 = *out;
  *out = pQVar4 + lVar6;
  pQVar1 = &(p->a).a.a.a.b;
  lVar3 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar4 + lVar6);
  pQVar4 = *out;
  *out = pQVar4 + lVar3;
  bVar2 = (p->a).a.a.b.ch;
  pQVar4 = pQVar4 + lVar3 + 1;
  *out = pQVar4;
  pQVar4[-1].ucs = (ushort)bVar2;
  lVar3 = (p->a).a.b.d.size;
  if (lVar3 != 0) {
    pcVar7 = (p->a).a.b.d.ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar4,pcVar7,lVar3 * 2);
  }
  pQVar4 = *out;
  *out = pQVar4 + lVar3;
  bVar2 = (p->a).b.ch;
  pQVar4 = pQVar4 + lVar3;
  *out = pQVar4 + 1;
  pQVar4->ucs = (ushort)bVar2;
  lVar3 = (p->b->d).size;
  if (lVar3 != 0) {
    pcVar7 = (p->b->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar4 + 1,pcVar7,lVar3 * 2);
  }
  *out = *out + lVar3;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }